

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O1

void Gia_ManCollapseDeref(DdManager *dd,Vec_Ptr_t *vFuncs)

{
  long lVar1;
  
  if (0 < vFuncs->nSize) {
    lVar1 = 0;
    do {
      if ((DdNode *)vFuncs->pArray[lVar1] != (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,(DdNode *)vFuncs->pArray[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < vFuncs->nSize);
  }
  if (vFuncs->pArray != (void **)0x0) {
    free(vFuncs->pArray);
    vFuncs->pArray = (void **)0x0;
  }
  if (vFuncs != (Vec_Ptr_t *)0x0) {
    free(vFuncs);
    return;
  }
  return;
}

Assistant:

void Gia_ManCollapseDeref( DdManager * dd, Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc; int i;
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncs );
}